

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O3

ssize_t archive_write_shar_data_uuencode(archive_write *a,void *buff,size_t length)

{
  shar *shar;
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ulong __n;
  
  shar = (shar *)a->format_data;
  if (shar->has_data == 0) {
    return 0;
  }
  sVar1 = shar->outpos;
  __n = length;
  if (sVar1 != 0) {
    uVar3 = 0x2d - sVar1;
    if (length <= 0x2d - sVar1) {
      uVar3 = length;
    }
    memcpy(shar->outbuff + sVar1,buff,uVar3);
    __n = shar->outpos + uVar3;
    if (__n < 0x2d) goto LAB_00155f58;
    iVar2 = _uuencode_line(a,shar,shar->outbuff,0x2d);
    if (iVar2 != 0) {
      return -0x1e;
    }
    buff = (void *)((long)buff + uVar3);
    __n = length - uVar3;
  }
  for (; 0x2c < __n; __n = __n - 0x2d) {
    iVar2 = _uuencode_line(a,shar,(char *)buff,0x2d);
    if (iVar2 != 0) {
      return -0x1e;
    }
    uVar3 = (shar->work).length;
    if (0xffff < uVar3) {
      iVar2 = __archive_write_output(a,(shar->work).s,uVar3);
      if (iVar2 != 0) {
        return -0x1e;
      }
      (shar->work).length = 0;
    }
    buff = (void *)((long)buff + 0x2d);
  }
  if (__n == 0) {
    return length;
  }
  memcpy(shar->outbuff,buff,__n);
LAB_00155f58:
  shar->outpos = __n;
  return length;
}

Assistant:

static ssize_t
archive_write_shar_data_uuencode(struct archive_write *a, const void *buff,
    size_t length)
{
	struct shar *shar;
	const char *src;
	size_t n;
	int ret;

	shar = (struct shar *)a->format_data;
	if (!shar->has_data)
		return (ARCHIVE_OK);
	src = (const char *)buff;

	if (shar->outpos != 0) {
		n = 45 - shar->outpos;
		if (n > length)
			n = length;
		memcpy(shar->outbuff + shar->outpos, src, n);
		if (shar->outpos + n < 45) {
			shar->outpos += n;
			return length;
		}
		uuencode_line(a, shar, shar->outbuff, 45);
		src += n;
		n = length - n;
	} else {
		n = length;
	}

	while (n >= 45) {
		uuencode_line(a, shar, src, 45);
		src += 45;
		n -= 45;

		if (shar->work.length < 65536)
			continue;
		ret = __archive_write_output(a, shar->work.s,
		    shar->work.length);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		archive_string_empty(&shar->work);
	}
	if (n != 0) {
		memcpy(shar->outbuff, src, n);
		shar->outpos = n;
	}
	return (length);
}